

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void prepvalue(rnndb *db,rnnvalue *val,char *prefix,rnnvarinfo *parvi)

{
  char *b;
  char *pcVar1;
  
  pcVar1 = catstr(prefix,val->name);
  val->fullname = pcVar1;
  prepvarinfo(db,pcVar1,&val->varinfo,parvi);
  if (((val->varinfo).dead == 0) && (pcVar1 = (val->varinfo).prefix, pcVar1 != (char *)0x0)) {
    b = val->fullname;
    pcVar1 = catstr(pcVar1,b);
    val->fullname = pcVar1;
    free(b);
    return;
  }
  return;
}

Assistant:

static void prepvalue(struct rnndb *db, struct rnnvalue *val, char *prefix, struct rnnvarinfo *parvi) {
	val->fullname = catstr(prefix, val->name);
	prepvarinfo (db, val->fullname, &val->varinfo, parvi);
	if (val->varinfo.dead)
		return;
	if (val->varinfo.prefix) {
		char *tmp = val->fullname;
		val->fullname = catstr(val->varinfo.prefix, val->fullname);
		free(tmp);
	}
}